

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

double __thiscall
libchars::command_cursor::remainder_abi_cxx11_(command_cursor *this,double __x,double __y)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long in_RSI;
  double dVar4;
  double extraout_XMM0_Qa;
  
  lVar1 = *(long *)(in_RSI + 0x30);
  if (lVar1 == *(long *)(in_RSI + 0x10)) {
    uVar2 = *(ulong *)(in_RSI + 0x70);
    if (uVar2 == 0) goto LAB_0010b2ce;
    uVar3 = *(long *)(in_RSI + 0x80) + *(long *)(in_RSI + 0x78);
  }
  else {
    if (lVar1 == *(long *)(in_RSI + 0x38)) {
      lVar1 = *(long *)(*(long *)(in_RSI + 0x48) + -8) + 0x200;
    }
    uVar2 = *(ulong *)(lVar1 + -8);
    if (uVar2 == 0) goto LAB_0010b2ce;
    uVar3 = *(ulong *)(in_RSI + 0x80);
  }
  if (uVar3 < *(ulong *)(uVar2 + 8)) {
    dVar4 = (double)std::__cxx11::string::substr((ulong)this,uVar2);
    return dVar4;
  }
LAB_0010b2ce:
  (this->S).c.super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>
  ._M_impl.super__Deque_impl_data._M_map =
       &(this->S).c.
        super__Deque_base<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>.
        _M_impl.super__Deque_impl_data._M_start._M_cur;
  std::__cxx11::string::_M_construct<char_const*>((string *)this,"");
  return extraout_XMM0_Qa;
}

Assistant:

std::string command_cursor::remainder() const
    {
        if (S.empty()) {
            if (root != NULL && (root_idx + idx) < root->part.length())
                return root->part.substr(root_idx + idx);
        }
        else {
            command_node *n = S.top();
            if (n != NULL && idx < n->part.length())
                return n->part.substr(idx);
        }
        return "";
    }